

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasTable(Validator *this,Location *loc,Opcode opcode)

{
  Module *extraout_RAX;
  Module *pMVar1;
  Info local_50;
  Opcode local_24 [2];
  Opcode opcode_local;
  
  pMVar1 = this->current_module_;
  if ((pMVar1->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (pMVar1->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_24[0].enum_ = opcode.enum_;
    Opcode::GetInfo(&local_50,local_24);
    PrintError(this,loc,"%s requires an imported or defined table.",local_50.name);
    pMVar1 = extraout_RAX;
  }
  return SUB81(pMVar1,0);
}

Assistant:

bool Validator::CheckHasTable(const Location* loc, Opcode opcode) {
  if (current_module_->tables.size() == 0) {
    PrintError(loc, "%s requires an imported or defined table.",
               opcode.GetName());
    return false;
  }

  return true;
}